

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O0

void __thiscall RigidBodyDynamics::FixedBody::FixedBody(FixedBody *this)

{
  Vector3_t::Vector3_t((Vector3_t *)0x84b22c);
  Matrix3_t::Matrix3_t((Matrix3_t *)0x84b23a);
  Math::SpatialTransform::SpatialTransform((SpatialTransform *)this);
  Math::SpatialTransform::SpatialTransform((SpatialTransform *)this);
  return;
}

Assistant:

struct RBDL_DLLAPI FixedBody {
  /// \brief The mass of the body
  Math::Scalar mMass;
  /// \brief The position of the center of mass in body coordinates
  Math::Vector3d mCenterOfMass;
  /// \brief The spatial inertia that contains both mass and inertia information
  Math::Matrix3d mInertia;

  /// \brief Id of the movable body that this fixed body is attached to.
  unsigned int mMovableParent;
  /// \brief Transforms spatial quantities expressed for the parent to the
  // fixed body.
  Math::SpatialTransform mParentTransform;
  Math::SpatialTransform mBaseTransform;

  static FixedBody CreateFromBody (const Body& body)
  {
    FixedBody fbody;

    fbody.mMass = body.mMass;
    fbody.mCenterOfMass = body.mCenterOfMass;
    fbody.mInertia = body.mInertia;

    return fbody;
  }
}